

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O0

void findNodeOutflows(double lamda,double *dH,double *xQ,Network *nw)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  double local_70;
  double dqdh;
  double q;
  double h;
  Node *node_1;
  int i;
  int nodeCount;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  Network *nw_local;
  double *xQ_local;
  double *dH_local;
  double lamda_local;
  
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(&nw->nodes);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(&nw->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&node);
    if (!bVar1) break;
    ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    _i = *ppNVar3;
    _i->outflow = 0.0;
    _i->qGrad = 0.0;
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  if (nw->leakageModel != (LeakageModel *)0x0) {
    findLeakageFlows(lamda,dH,xQ,nw);
  }
  node_1._4_4_ = Network::count(nw,NODE);
  for (node_1._0_4_ = 0; (int)node_1 < node_1._4_4_; node_1._0_4_ = (int)node_1 + 1) {
    h = (double)Network::node(nw,(int)node_1);
    q = lamda * dH[(int)node_1] + ((Node *)h)->head;
    dqdh = 0.0;
    local_70 = 0.0;
    iVar2 = (*(((Node *)h)->super_Element)._vptr_Element[2])();
    if (iVar2 == 0) {
      dqdh = (double)(**(code **)(*(long *)h + 0x38))(q,h,&local_70);
      *(double *)((long)h + 0x68) = local_70 + *(double *)((long)h + 0x68);
      *(double *)((long)h + 0x80) = dqdh + *(double *)((long)h + 0x80);
      xQ[(int)node_1] = xQ[(int)node_1] - dqdh;
      if ((*(byte *)((long)h + 0x58) & 1) == 0) {
        dqdh = (double)(**(code **)(*(long *)h + 0x30))(q,h,nw,&local_70);
        *(double *)((long)h + 0x68) = local_70 + *(double *)((long)h + 0x68);
        xQ[(int)node_1] = xQ[(int)node_1] - dqdh;
      }
      else {
        dqdh = xQ[(int)node_1];
        xQ[(int)node_1] = xQ[(int)node_1] - dqdh;
      }
      *(double *)((long)h + 0x78) = dqdh;
      *(double *)((long)h + 0x80) = dqdh + *(double *)((long)h + 0x80);
    }
    else {
      *(double *)((long)h + 0x80) = xQ[(int)node_1];
      xQ[(int)node_1] = 0.0;
    }
  }
  return;
}

Assistant:

void findNodeOutflows(double lamda, double dH[], double xQ[], Network* nw)
{
    // ... initialize node outflows and their gradients w.r.t. head

    for (Node* node : nw->nodes)
    {
        node->outflow = 0.0;
        node->qGrad = 0.0;
    }

    // ... find pipe leakage flows & assign them to node outflows

    if ( nw->leakageModel ) findLeakageFlows(lamda, dH, xQ, nw);

    // ... add emitter flows and demands to node outflows

    int nodeCount = nw->count(Element::NODE);
    for (int i = 0; i < nodeCount; i++)
    {
        Node* node = nw->node(i);
        double h = node->head + lamda * dH[i];
        double q = 0.0;
        double dqdh = 0.0;

        // ... for junctions, outflow depends on head

        if ( node->type() == Node::JUNCTION )
        {
            // ... contribution from emitter flow

            q = node->findEmitterFlow(h, dqdh);
            node->qGrad += dqdh;
            node->outflow += q;
            xQ[i] -= q;

            // ... contribution from demand flow

            // ... for fixed grade junction, demand is remaining flow excess
            if ( node->fixedGrade )
            {
                q = xQ[i];
                xQ[i] -= q;
            }

            // ... otherwise junction has pressure-dependent demand
            else
            {
                q = node->findActualDemand(nw, h, dqdh);
                node->qGrad += dqdh;
                xQ[i] -= q;
            }
            node->actualDemand = q;
            node->outflow += q;
        }

        // ... for tanks and reservoirs all flow excess becomes outflow

        else
        {
            node->outflow = xQ[i];
            xQ[i] = 0.0;
        }
    }
}